

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

RangeType __thiscall
soplex::SoPlexBase<double>::_rangeTypeRational
          (SoPlexBase<double> *this,Rational *lower,Rational *upper)

{
  type_conflict5 tVar1;
  type_conflict5 tVar2;
  bool bVar3;
  RangeType RVar4;
  
  tVar1 = boost::multiprecision::operator<=(lower,&this->_rationalNegInfty);
  tVar2 = boost::multiprecision::operator>=(upper,&this->_rationalPosInfty);
  if (tVar1) {
    RVar4 = (uint)!tVar2 * 2;
  }
  else if (tVar2) {
    RVar4 = RANGETYPE_LOWER;
  }
  else {
    bVar3 = boost::multiprecision::default_ops::
            eval_eq<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
                      (&lower->m_backend,&upper->m_backend);
    RVar4 = bVar3 + RANGETYPE_BOXED;
  }
  return RVar4;
}

Assistant:

typename SoPlexBase<R>::RangeType SoPlexBase<R>::_rangeTypeRational(const Rational& lower,
      const Rational& upper) const
{
   assert(lower <= upper);

   if(lower <= _rationalNegInfty)
   {
      if(upper >= _rationalPosInfty)
         return RANGETYPE_FREE;
      else
         return RANGETYPE_UPPER;
   }
   else
   {
      if(upper >= _rationalPosInfty)
         return RANGETYPE_LOWER;
      else if(lower == upper)
         return RANGETYPE_FIXED;
      else
         return RANGETYPE_BOXED;
   }
}